

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O1

ArenaBlock * __thiscall
google::protobuf::internal::ThreadSafeArena::FirstBlock(ThreadSafeArena *this,void *buf,size_t size)

{
  Nonnull<const_char_*> pcVar1;
  undefined1 *puVar2;
  
  if (((ulong)buf & 7) == 0) {
    pcVar1 = (Nonnull<const_char_*>)0x0;
  }
  else {
    pcVar1 = absl::lts_20250127::log_internal::MakeCheckOpString<unsigned_long,long>
                       ((ulong)buf & 7,0,"reinterpret_cast<uintptr_t>(buf) & 7 == 0u");
  }
  if (pcVar1 == (Nonnull<const_char_*>)0x0) {
    if (size < 0x11 || buf == (void *)0x0) {
      puVar2 = (anonymous_namespace)::kSentryArenaBlock;
    }
    else {
      *(undefined1 *)buf = 0;
      *(undefined1 *)((long)buf + (size - 1)) = 0;
      *(byte *)&(this->alloc_policy_).policy_ = (byte)(this->alloc_policy_).policy_ | 1;
      ArenaBlock::ArenaBlock((ArenaBlock *)buf,(ArenaBlock *)0x0,size);
      puVar2 = (undefined1 *)buf;
    }
    return (ArenaBlock *)puVar2;
  }
  FirstBlock();
}

Assistant:

ArenaBlock* ThreadSafeArena::FirstBlock(void* buf, size_t size) {
  ABSL_DCHECK_EQ(reinterpret_cast<uintptr_t>(buf) & 7, 0u);
  if (buf == nullptr || size <= kBlockHeaderSize) {
    return SentryArenaBlock();
  }
  // Record user-owned block.

  if constexpr (internal::PerformDebugChecks()) {
    // Touch block to verify it is addressable.
    if (size > 0) {
      static_cast<char*>(buf)[0] = 0;
      static_cast<char*>(buf)[size - 1] = 0;
    }
  }

  ABSL_ANNOTATE_MEMORY_IS_UNINITIALIZED(buf, size);
  alloc_policy_.set_is_user_owned_initial_block(true);
  return new (buf) ArenaBlock{nullptr, size};
}